

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall Darts::Details::DawgBuilder::expand_table(DawgBuilder *this)

{
  size_t sVar1;
  size_t i;
  ulong uVar2;
  id_type hash_id;
  uint local_1c;
  
  sVar1 = (this->table_).size_;
  AutoPool<unsigned_int>::clear(&this->table_);
  local_1c = 0;
  AutoPool<unsigned_int>::resize(&this->table_,sVar1 * 2,&local_1c);
  for (uVar2 = 1; uVar2 < (this->units_).size_; uVar2 = uVar2 + 1) {
    if (((this->labels_).buf_.array_[uVar2 & 0xffffffff] == '\0') ||
       (((this->units_).buf_.array_[(uVar2 & 0xffffffff) * 4] & 2U) != 0)) {
      find_unit(this,(id_type)uVar2,&hash_id);
      *(id_type *)((this->table_).buf_.array_ + (ulong)hash_id * 4) = (id_type)uVar2;
    }
  }
  return;
}

Assistant:

inline void DawgBuilder::expand_table() {
  std::size_t table_size = table_.size() << 1;
  table_.clear();
  table_.resize(table_size, 0);

  for (std::size_t i = 1; i < units_.size(); ++i) {
    id_type id = static_cast<id_type>(i);
    if (labels_[id] == '\0' || units_[id].is_state()) {
      id_type hash_id;
      find_unit(id, &hash_id);
      table_[hash_id] = id;
    }
  }
}